

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O0

void __thiscall
JsonString_SlashUnicodeUpper_Test::JsonString_SlashUnicodeUpper_Test
          (JsonString_SlashUnicodeUpper_Test *this)

{
  JsonString_SlashUnicodeUpper_Test *this_local;
  
  anon_unknown.dwarf_1403f7::JsonString::JsonString(&this->super_JsonString);
  (this->super_JsonString).super_Test._vptr_Test =
       (_func_int **)&PTR__JsonString_SlashUnicodeUpper_Test_0025be88;
  return;
}

Assistant:

TEST_F (JsonString, SlashUnicodeUpper) {
    EXPECT_CALL (callbacks_, string_value ("/")).Times (1);

    auto p = json::make_parser (proxy_);
    p.input ("\"\\u002F\"").eof ();
    EXPECT_FALSE (p.has_error ()) << "Expected the parse to succeed";
    EXPECT_FALSE (p.last_error ()) << "Expected the parse error to be zero";
    EXPECT_EQ (p.coordinate (), (json::coord{9U, 1U}));
}